

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

void __thiscall
LruHash<IPAsKeyLRU>::LruMoveToMostRecent(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool stored)

{
  IPAsKeyLRU *pIVar1;
  IPAsKeyLRU *pIVar2;
  LruHash<IPAsKeyLRU> *pLVar3;
  IPAsKeyLRU **ppIVar4;
  
  if (key != (IPAsKeyLRU *)0x0) {
    if (!stored) {
      pIVar1 = key->MoreRecentKey;
      pIVar2 = key->LessRecentKey;
      pLVar3 = (LruHash<IPAsKeyLRU> *)&pIVar1->LessRecentKey;
      if (pIVar1 == (IPAsKeyLRU *)0x0) {
        pLVar3 = this;
      }
      ppIVar4 = &pIVar2->MoreRecentKey;
      if (pIVar2 == (IPAsKeyLRU *)0x0) {
        ppIVar4 = &this->LeastRecentlyUsed;
      }
      pLVar3->MostRecentlyUsed = pIVar2;
      *ppIVar4 = pIVar1;
      key->MoreRecentKey = (IPAsKeyLRU *)0x0;
      key->LessRecentKey = (IPAsKeyLRU *)0x0;
    }
    pIVar1 = this->MostRecentlyUsed;
    key->LessRecentKey = pIVar1;
    if (pIVar1 != (IPAsKeyLRU *)0x0) {
      pIVar1->MoreRecentKey = key;
    }
    this->MostRecentlyUsed = key;
    if (this->LeastRecentlyUsed == (IPAsKeyLRU *)0x0) {
      this->LeastRecentlyUsed = key;
      return;
    }
  }
  return;
}

Assistant:

void LruMoveToMostRecent(KeyObj * key, bool stored)
    {
        if (key != NULL)
        {
            if (!stored)
            {
                LruUnlink(key);
            }
            key->LessRecentKey = MostRecentlyUsed;
            if (MostRecentlyUsed != NULL)
            {
                MostRecentlyUsed->MoreRecentKey = key;
            }
            MostRecentlyUsed = key;

            if (LeastRecentlyUsed == NULL)
            {
                LeastRecentlyUsed = key;
            }
        }
    }